

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

size_t absl::lts_20240722::cord_internal::CordzInfo::FillParentStack(CordzInfo *src,void **stack)

{
  void **stack_local;
  CordzInfo *src_local;
  
  if (stack != (void **)0x0) {
    if (src == (CordzInfo *)0x0) {
      src_local = (CordzInfo *)0x0;
    }
    else if (src->parent_stack_depth_ == 0) {
      memcpy(stack,src->stack_,src->stack_depth_ << 3);
      src_local = (CordzInfo *)src->stack_depth_;
    }
    else {
      memcpy(stack,src->parent_stack_,src->parent_stack_depth_ << 3);
      src_local = (CordzInfo *)src->parent_stack_depth_;
    }
    return (size_t)src_local;
  }
  __assert_fail("stack",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0x128,
                "static size_t absl::cord_internal::CordzInfo::FillParentStack(const CordzInfo *, void **)"
               );
}

Assistant:

size_t CordzInfo::FillParentStack(const CordzInfo* src, void** stack) {
  assert(stack);
  if (src == nullptr) return 0;
  if (src->parent_stack_depth_) {
    memcpy(stack, src->parent_stack_, src->parent_stack_depth_ * sizeof(void*));
    return src->parent_stack_depth_;
  }
  memcpy(stack, src->stack_, src->stack_depth_ * sizeof(void*));
  return src->stack_depth_;
}